

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_IndexedFaceSet(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  size_type sVar7;
  DeadlyImportError *this_00;
  CX3DImporter_NodeElement_IndexedSet *this_01;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  byte local_149;
  CX3DImporter_NodeElement_IndexedSet *pCStack_148;
  bool close_found;
  CX3DImporter_NodeElement_IndexedSet *ne_alias;
  string local_138;
  undefined4 local_118;
  allocator<char> local_111;
  undefined1 local_110 [8];
  string an;
  uint local_dc;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  vector<int,_std::allocator<int>_> texCoordIndex;
  undefined1 local_b0 [6];
  bool solid;
  bool normalPerVertex;
  vector<int,_std::allocator<int>_> normalIndex;
  undefined1 local_90 [4];
  float creaseAngle;
  vector<int,_std::allocator<int>_> coordIndex;
  undefined1 local_70 [6];
  bool convex;
  bool colorPerVertex;
  vector<int,_std::allocator<int>_> colorIndex;
  string local_50 [7];
  bool ccw;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_50);
  colorIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_70);
  coordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  coordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_90);
  normalIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0.0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_b0);
  texCoordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  texCoordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&ne);
  _idx_end = (CX3DImporter_NodeElement_IndexedSet *)0x0;
  local_dc = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_dc < iVar2; local_dc = local_dc + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_dc);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_110,(char *)CONCAT44(extraout_var,iVar3),&local_111);
    std::allocator<char>::~allocator(&local_111);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_110,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_dc);
      std::__cxx11::string::operator=(local_50,(char *)CONCAT44(extraout_var_00,iVar3));
      local_118 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_110,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_dc);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar3))
        ;
        local_118 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_110,"bboxCenter");
        if (bVar1) {
          local_118 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_110,"bboxSize");
          if (bVar1) {
            local_118 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_110,"containerField");
            if (bVar1) {
              local_118 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_110,"ccw");
              if (bVar1) {
                colorIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._7_1_ =
                     XML_ReadNode_GetAttrVal_AsBool(this,local_dc);
                local_118 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_110,"colorIndex");
                if (bVar1) {
                  XML_ReadNode_GetAttrVal_AsArrI32
                            (this,local_dc,(vector<int,_std::allocator<int>_> *)local_70);
                  local_118 = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_110,"colorPerVertex");
                  if (bVar1) {
                    coordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._7_1_ =
                         XML_ReadNode_GetAttrVal_AsBool(this,local_dc);
                    local_118 = 4;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_110,"convex");
                    if (bVar1) {
                      coordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._6_1_ =
                           XML_ReadNode_GetAttrVal_AsBool(this,local_dc);
                      local_118 = 4;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_110,"coordIndex");
                      if (bVar1) {
                        XML_ReadNode_GetAttrVal_AsArrI32
                                  (this,local_dc,(vector<int,_std::allocator<int>_> *)local_90);
                        local_118 = 4;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_110,"creaseAngle");
                        if (bVar1) {
                          normalIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_ =
                               XML_ReadNode_GetAttrVal_AsFloat(this,local_dc);
                          local_118 = 4;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_110,"normalIndex");
                          if (bVar1) {
                            XML_ReadNode_GetAttrVal_AsArrI32
                                      (this,local_dc,(vector<int,_std::allocator<int>_> *)local_b0);
                            local_118 = 4;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_110,"normalPerVertex");
                            if (bVar1) {
                              texCoordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage._7_1_ =
                                   XML_ReadNode_GetAttrVal_AsBool(this,local_dc);
                              local_118 = 4;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_110,"solid");
                              if (bVar1) {
                                texCoordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._6_1_ =
                                     XML_ReadNode_GetAttrVal_AsBool(this,local_dc);
                                local_118 = 4;
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_110,"texCoordIndex");
                                if (bVar1) {
                                  XML_ReadNode_GetAttrVal_AsArrI32
                                            (this,local_dc,(vector<int,_std::allocator<int>_> *)&ne)
                                  ;
                                  local_118 = 4;
                                }
                                else {
                                  Throw_IncorrectAttr(this,(string *)local_110);
                                  local_118 = 0;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_110);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_IndexedFaceSet,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_90);
    if (sVar7 == 0) {
      ne_alias._6_1_ = 1;
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,
                 "IndexedFaceSet must contain not empty \"coordIndex\" attribute.",
                 (allocator<char> *)((long)&ne_alias + 7));
      DeadlyImportError::DeadlyImportError(this_00,&local_138);
      ne_alias._6_1_ = 0;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    this_01 = (CX3DImporter_NodeElement_IndexedSet *)operator_new(0xf0);
    CX3DImporter_NodeElement_IndexedSet::CX3DImporter_NodeElement_IndexedSet
              (this_01,ENET_IndexedFaceSet,this->NodeElement_Cur);
    _idx_end = this_01;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)
                 &(_idx_end->super_CX3DImporter_NodeElement_Geometry3D).
                  super_CX3DImporter_NodeElement.ID,local_50);
    }
    pCStack_148 = _idx_end;
    (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).field_0x71 =
         colorIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._7_1_ & 1;
    std::vector<int,_std::allocator<int>_>::operator=
              (&_idx_end->ColorIndex,(vector<int,_std::allocator<int>_> *)local_70);
    pCStack_148->ColorPerVertex =
         (bool)(coordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
    pCStack_148->Convex =
         (bool)(coordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._6_1_ & 1);
    std::vector<int,_std::allocator<int>_>::operator=
              (&pCStack_148->CoordIndex,(vector<int,_std::allocator<int>_> *)local_90);
    pCStack_148->CreaseAngle =
         normalIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
    std::vector<int,_std::allocator<int>_>::operator=
              (&pCStack_148->NormalIndex,(vector<int,_std::allocator<int>_> *)local_b0);
    pCStack_148->NormalPerVertex =
         (bool)(texCoordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
    (pCStack_148->super_CX3DImporter_NodeElement_Geometry3D).Solid =
         (bool)(texCoordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._6_1_ & 1);
    std::vector<int,_std::allocator<int>_>::operator=
              (&pCStack_148->TexCoordIndex,(vector<int,_std::allocator<int>_> *)&ne);
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((uVar4 & 1) == 0) {
      ParseHelper_Node_Enter(this,(CX3DImporter_NodeElement *)_idx_end);
      local_149 = 0;
      do {
        do {
          while( true ) {
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])
                              ();
            if ((uVar4 & 1) == 0) goto LAB_00a1bb8f;
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])
                              ();
            if (iVar2 != 1) break;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_170,"Color",&local_171);
            bVar1 = XML_CheckNode_NameEqual(this,&local_170);
            std::__cxx11::string::~string((string *)&local_170);
            std::allocator<char>::~allocator(&local_171);
            if (bVar1) {
              ParseNode_Rendering_Color(this);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_198,"ColorRGBA",&local_199);
              bVar1 = XML_CheckNode_NameEqual(this,&local_198);
              std::__cxx11::string::~string((string *)&local_198);
              std::allocator<char>::~allocator(&local_199);
              if (bVar1) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1c0,"Coordinate",&local_1c1);
                bVar1 = XML_CheckNode_NameEqual(this,&local_1c0);
                std::__cxx11::string::~string((string *)&local_1c0);
                std::allocator<char>::~allocator(&local_1c1);
                if (bVar1) {
                  ParseNode_Rendering_Coordinate(this);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1e8,"Normal",&local_1e9);
                  bVar1 = XML_CheckNode_NameEqual(this,&local_1e8);
                  std::__cxx11::string::~string((string *)&local_1e8);
                  std::allocator<char>::~allocator(&local_1e9);
                  if (bVar1) {
                    ParseNode_Rendering_Normal(this);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_210,"TextureCoordinate",&local_211);
                    bVar1 = XML_CheckNode_NameEqual(this,&local_210);
                    std::__cxx11::string::~string((string *)&local_210);
                    std::allocator<char>::~allocator(&local_211);
                    if (bVar1) {
                      ParseNode_Texturing_TextureCoordinate(this);
                    }
                    else {
                      bVar1 = ParseHelper_CheckRead_X3DMetadataObject(this);
                      if (!bVar1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_238,"IndexedFaceSet",&local_239);
                        XML_CheckNode_SkipUnsupported(this,&local_238);
                        std::__cxx11::string::~string((string *)&local_238);
                        std::allocator<char>::~allocator(&local_239);
                      }
                    }
                  }
                }
              }
            }
          }
          pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                   operator->(&this->mReader);
          iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])()
          ;
        } while (iVar2 != 2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_260,"IndexedFaceSet",&local_261);
        bVar1 = XML_CheckNode_NameEqual(this,&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::allocator<char>::~allocator(&local_261);
      } while (!bVar1);
      local_149 = 1;
LAB_00a1bb8f:
      if ((local_149 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_288,"IndexedFaceSet",&local_289);
        Throw_CloseNotFound(this,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator(&local_289);
      }
      ParseHelper_Node_Exit(this);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&ne);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_90);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_IndexedFaceSet()
{
    std::string use, def;
    bool ccw = true;
    std::vector<int32_t> colorIndex;
    bool colorPerVertex = true;
    bool convex = true;
    std::vector<int32_t> coordIndex;
    float creaseAngle = 0;
    std::vector<int32_t> normalIndex;
    bool normalPerVertex = true;
    bool solid = true;
    std::vector<int32_t> texCoordIndex;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("colorIndex", colorIndex, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("convex", convex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("coordIndex", coordIndex, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("creaseAngle", creaseAngle, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_REF("normalIndex", normalIndex, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("texCoordIndex", texCoordIndex, XML_ReadNode_GetAttrVal_AsArrI32);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_IndexedFaceSet, ne);
	}
	else
	{
		// check data
		if(coordIndex.size() == 0) throw DeadlyImportError("IndexedFaceSet must contain not empty \"coordIndex\" attribute.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_IndexedSet(CX3DImporter_NodeElement::ENET_IndexedFaceSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_IndexedSet& ne_alias = *((CX3DImporter_NodeElement_IndexedSet*)ne);

		ne_alias.CCW = ccw;
		ne_alias.ColorIndex = colorIndex;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.Convex = convex;
		ne_alias.CoordIndex = coordIndex;
		ne_alias.CreaseAngle = creaseAngle;
		ne_alias.NormalIndex = normalIndex;
		ne_alias.NormalPerVertex = normalPerVertex;
		ne_alias.Solid = solid;
		ne_alias.TexCoordIndex = texCoordIndex;
        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("IndexedFaceSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("IndexedFaceSet");

			MACRO_NODECHECK_LOOPEND("IndexedFaceSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}